

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpluginloader.cpp
# Opt level: O2

bool __thiscall QPluginLoader::unload(QPluginLoader *this)

{
  QLibraryPrivate *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->did_load == true) {
    this->did_load = false;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      bVar5 = QLibraryPrivate::unload(this->d,UnloadSys);
      return bVar5;
    }
  }
  else {
    if (this->d != (QLibraryPrivate *)0x0) {
      tr((QString *)&local_38,"The plugin was not loaded.",(char *)0x0,-1);
      pQVar1 = this->d;
      pDVar3 = (pQVar1->errorString).d.d;
      pcVar4 = (pQVar1->errorString).d.ptr;
      (pQVar1->errorString).d.d = local_38.d;
      (pQVar1->errorString).d.ptr = local_38.ptr;
      qVar2 = (pQVar1->errorString).d.size;
      (pQVar1->errorString).d.size = local_38.size;
      local_38.d = pDVar3;
      local_38.ptr = pcVar4;
      local_38.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return false;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QPluginLoader::unload()
{
    if (did_load) {
        did_load = false;
        return d->unload();
    }
    if (d) // Ouch
        d->errorString = tr("The plugin was not loaded.");
    return false;
}